

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  float fVar1;
  ImDrawListSharedData *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ImVec2 *pIVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int a;
  ImVec2 *pIVar13;
  
  if (radius <= 0.0) {
    iVar5 = (this->_Path).Size;
    iVar12 = (this->_Path).Capacity;
    if (iVar5 == iVar12) {
      iVar5 = iVar5 + 1;
      if (iVar12 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar12 / 2 + iVar12;
      }
      if (iVar5 < iVar8) {
        iVar5 = iVar8;
      }
      if (iVar12 < iVar5) {
        pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
        pIVar13 = (this->_Path).Data;
        if (pIVar13 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar13,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar5;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    if (a_step < 1) {
      uVar4 = _CalcCircleAutoSegmentCount(this,radius);
      a_step = (int)(0x30 / (ulong)uVar4);
    }
    uVar4 = 0xc;
    if (a_step < 0xc) {
      uVar4 = a_step;
    }
    if (a_step == 0) {
      uVar4 = 1;
    }
    uVar7 = a_max_sample - a_min_sample;
    uVar9 = -uVar7;
    if (0 < (int)uVar7) {
      uVar9 = uVar7;
    }
    uVar7 = uVar4;
    if (uVar4 < 2) {
      iVar5 = uVar9 + 1;
      bVar3 = false;
      uVar7 = 1;
    }
    else {
      uVar10 = uVar9 % uVar4;
      bVar3 = uVar10 != 0;
      if (uVar10 == 0) {
        iVar5 = uVar9 / uVar4 + 1;
      }
      else {
        iVar5 = uVar9 / uVar4 + 2;
        bVar3 = true;
        if (a_max_sample != a_min_sample) {
          uVar7 = uVar4 - (int)(uVar4 - uVar10) / 2;
        }
      }
    }
    iVar12 = (this->_Path).Size;
    iVar5 = iVar5 + iVar12;
    iVar8 = (this->_Path).Capacity;
    if (iVar8 < iVar5) {
      if (iVar8 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar8 / 2 + iVar8;
      }
      if (iVar11 <= iVar5) {
        iVar11 = iVar5;
      }
      if (iVar8 < iVar11) {
        pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar11 << 3);
        pIVar13 = (this->_Path).Data;
        if (pIVar13 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar13,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar11;
      }
    }
    (this->_Path).Size = iVar5;
    iVar5 = a_min_sample;
    if (0x2f < (uint)a_min_sample) {
      iVar5 = ((uint)(a_min_sample / 6 + (a_min_sample >> 0x1f)) >> 3) - (a_min_sample >> 0x1f);
      iVar8 = a_min_sample + iVar5 * -0x30;
      iVar5 = a_min_sample + 0x30 + iVar5 * -0x30;
      if (-1 < iVar8) {
        iVar5 = iVar8;
      }
    }
    pIVar13 = (this->_Path).Data + iVar12;
    pIVar2 = this->_Data;
    if (a_max_sample < a_min_sample) {
      do {
        iVar12 = iVar5 + 0x30;
        if (-1 < iVar5) {
          iVar12 = iVar5;
        }
        fVar1 = pIVar2->ArcFastVtx[iVar12].y;
        pIVar13->x = pIVar2->ArcFastVtx[iVar12].x * radius + center->x;
        pIVar13->y = fVar1 * radius + center->y;
        pIVar13 = pIVar13 + 1;
        a_min_sample = a_min_sample - uVar7;
        iVar5 = iVar12 - uVar7;
        uVar7 = uVar4;
      } while (a_max_sample <= a_min_sample);
    }
    else {
      do {
        iVar12 = iVar5 + -0x30;
        if (iVar5 < 0x30) {
          iVar12 = iVar5;
        }
        fVar1 = pIVar2->ArcFastVtx[iVar12].y;
        pIVar13->x = pIVar2->ArcFastVtx[iVar12].x * radius + center->x;
        pIVar13->y = fVar1 * radius + center->y;
        pIVar13 = pIVar13 + 1;
        a_min_sample = a_min_sample + uVar7;
        iVar5 = iVar12 + uVar7;
        uVar7 = uVar4;
      } while (a_min_sample <= a_max_sample);
    }
    if (bVar3) {
      iVar5 = ((uint)(a_max_sample / 6 + (a_max_sample >> 0x1f)) >> 3) - (a_max_sample >> 0x1f);
      uVar9 = a_max_sample + iVar5 * -0x30;
      uVar4 = a_max_sample + 0x30 + iVar5 * -0x30;
      if (-1 < (int)uVar9) {
        uVar4 = uVar9;
      }
      fVar1 = this->_Data->ArcFastVtx[uVar4].y;
      pIVar13->x = this->_Data->ArcFastVtx[uVar4].x * radius + center->x;
      pIVar13->y = radius * fVar1 + center->y;
    }
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}